

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFormat.cpp
# Opt level: O0

void __thiscall
slang::ast::SFormat::TypeVisitor::visit(TypeVisitor *this,EnumType *type,ConstantValue *arg)

{
  bool bVar1;
  FormatBuffer *in_RDI;
  EnumValueSymbol *in_stack_00000068;
  SourceRange in_stack_00000070;
  EnumValueSymbol *member;
  specific_symbol_iterator<slang::ast::EnumValueSymbol> __end3;
  specific_symbol_iterator<slang::ast::EnumValueSymbol> __begin3;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
  *__range3;
  ConstantValue *in_stack_ffffffffffffff38;
  SourceRange *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  EnumValueSymbol *in_stack_ffffffffffffff48;
  string_view in_stack_ffffffffffffff58;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
  local_30;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
  *local_20;
  
  local_30 = EnumType::values((EnumType *)0x6d70b9);
  local_20 = &local_30;
  std::ranges::
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
  ::begin(local_20);
  std::ranges::
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_(std::ranges::subrange_kind)0>
  ::end(local_20);
  while( true ) {
    bVar1 = operator==<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>_>
                      ((self_type *)in_stack_ffffffffffffff40,
                       (specific_symbol_iterator<slang::ast::EnumValueSymbol> *)
                       in_stack_ffffffffffffff38);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &(in_RDI->buf).super_buffer<char>.size_;
      slang::ConstantValue::toString_abi_cxx11_
                ((ConstantValue *)in_stack_ffffffffffffff48,(bitwidth_t)((ulong)this_00 >> 0x20),
                 SUB81((ulong)this_00 >> 0x18,0),SUB81((ulong)this_00 >> 0x10,0));
      std::__cxx11::string::operator_cast_to_basic_string_view(this_00);
      FormatBuffer::append(in_RDI,in_stack_ffffffffffffff58);
      std::__cxx11::string::~string(this_00);
      return;
    }
    in_stack_ffffffffffffff48 =
         iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_false>
         ::operator*((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_false>
                      *)0x6d7130);
    SourceRange::SourceRange(in_stack_ffffffffffffff40);
    EnumValueSymbol::getValue(in_stack_00000068,in_stack_00000070);
    bVar1 = slang::operator==((ConstantValue *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    if (bVar1) break;
    iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_false>
    ::operator++<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>_>
              ((iterator_facade<slang::ast::Scope::specific_symbol_iterator<slang::ast::EnumValueSymbol>,_false>
                *)in_stack_ffffffffffffff40);
  }
  FormatBuffer::append(in_RDI,in_stack_ffffffffffffff58);
  return;
}

Assistant:

void visit(const EnumType& type, const ConstantValue& arg) {
        for (auto& member : type.values()) {
            if (member.getValue() == arg) {
                buffer.append(member.name);
                return;
            }
        }
        buffer.append(arg.toString());
    }